

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternTest.cpp
# Opt level: O0

bool __thiscall
PatternTest::TestOnePattern
          (PatternTest *this,char **test_strings,size_t nb_test_strings,uint32_t pattern)

{
  bool bVar1;
  size_t len_00;
  ulong local_80;
  size_t i;
  size_t len;
  uint8_t local_68 [4];
  uint32_t flags;
  uint8_t val [64];
  bool ret;
  uint32_t pattern_local;
  size_t nb_test_strings_local;
  char **test_strings_local;
  PatternTest *this_local;
  
  val[0x3b] = '\x01';
  val._60_4_ = pattern;
  for (local_80 = 0; (val[0x3b] & 1) != 0 && local_80 < nb_test_strings; local_80 = local_80 + 1) {
    len._4_4_ = 0;
    len_00 = strlen(test_strings[local_80]);
    bVar1 = NamePattern::Preprocess
                      ((uint8_t *)test_strings[local_80],len_00,local_68,
                       (uint32_t *)((long)&len + 4));
    if (bVar1) {
      if ((len._4_4_ & val._60_4_) == 0) {
        val[0x3b] = '\0';
      }
    }
    else {
      val[0x3b] = '\0';
    }
  }
  return (bool)(val[0x3b] & 1);
}

Assistant:

bool PatternTest::TestOnePattern(char const  ** test_strings,
    size_t nb_test_strings, uint32_t pattern)
{
    bool ret = true;
    uint8_t val[64];
    uint32_t flags;
    size_t len;

    for (size_t i = 0; ret && i < nb_test_strings; i++)
    {
        flags = 0;
        len = strlen(test_strings[i]);
        if (!NamePattern::Preprocess((uint8_t *)test_strings[i], len, val, &flags))
        {
            ret = false;
        }
        else if ((flags&pattern) == 0)
        {
            ret = false;
        }
    }

    return ret;
}